

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_multi.cc
# Opt level: O1

void display_tree_dfs(log_multi *b,node *node,uint32_t depth)

{
  ostream *poVar1;
  uint32_t uVar2;
  ulong uVar3;
  
  uVar2 = depth;
  while( true ) {
    for (; depth != 0; depth = depth - 1) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
    }
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," label = ",9);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," labels = ",10);
    if ((node->preds)._end != (node->preds)._begin) {
      uVar3 = 0;
      do {
        poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,":",1);
        poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\t",1);
        uVar3 = uVar3 + 1;
      } while (uVar3 < (ulong)(((long)(node->preds)._end - (long)(node->preds)._begin >> 3) *
                              -0x5555555555555555));
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
    std::ostream::put(-0x28);
    std::ostream::flush();
    if (node->internal == false) break;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Left",4);
    depth = uVar2 + 1;
    display_tree_dfs(b,(b->nodes)._begin + node->left,depth);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Right",5);
    node = (b->nodes)._begin + node->right;
    uVar2 = depth;
  }
  return;
}

Assistant:

void display_tree_dfs(log_multi& b, const node& node, uint32_t depth)
{
  for (uint32_t i = 0; i < depth; i++) cout << "\t";
  cout << node.min_count << " " << node.left << " " << node.right;
  cout << " label = " << node.max_count_label << " labels = ";
  for (size_t i = 0; i < node.preds.size(); i++)
    cout << node.preds[i].label << ":" << node.preds[i].label_count << "\t";
  cout << endl;

  if (node.internal)
  {
    cout << "Left";
    display_tree_dfs(b, b.nodes[node.left], depth + 1);

    cout << "Right";
    display_tree_dfs(b, b.nodes[node.right], depth + 1);
  }
}